

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddDotMinProduct6(Abc_ZddMan *p,int a,int b)

{
  int iVar1;
  int iVar2;
  Abc_ZddObj *pAVar3;
  Abc_ZddObj *pAVar4;
  int r;
  int t2;
  int t1;
  int b2;
  int r1;
  int r0;
  Abc_ZddObj *B;
  Abc_ZddObj *A;
  int b_local;
  int a_local;
  Abc_ZddMan *p_local;
  
  if (a == 0) {
    p_local._4_4_ = 0;
  }
  else if (b == 0) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = b;
    if ((a != 1) && (p_local._4_4_ = a, b != 1)) {
      if (b < a) {
        p_local._4_4_ = Abc_ZddDotMinProduct6(p,b,a);
      }
      else {
        p_local._4_4_ = Abc_ZddCacheLookup(p,a,b,0xb);
        if (p_local._4_4_ < 0) {
          pAVar3 = Abc_ZddNode(p,a);
          pAVar4 = Abc_ZddNode(p,b);
          if ((*(uint *)pAVar3 & 0x7fffffff) < (*(uint *)pAVar4 & 0x7fffffff)) {
            b2 = Abc_ZddDotMinProduct6(p,pAVar3->False,b);
            t1 = Abc_ZddDotMinProduct6(p,pAVar3->True,b);
          }
          else if ((*(uint *)pAVar4 & 0x7fffffff) < (*(uint *)pAVar3 & 0x7fffffff)) {
            b2 = Abc_ZddDotMinProduct6(p,a,pAVar4->False);
            t1 = Abc_ZddDotMinProduct6(p,a,pAVar4->True);
          }
          else {
            b2 = Abc_ZddDotMinProduct6(p,pAVar3->False,pAVar4->False);
            iVar1 = Abc_ZddMinUnion(p,pAVar4->False,pAVar4->True);
            iVar1 = Abc_ZddDotMinProduct6(p,pAVar3->True,iVar1);
            iVar2 = Abc_ZddDotMinProduct6(p,pAVar3->False,pAVar4->True);
            t1 = Abc_ZddMinUnion(p,iVar1,iVar2);
          }
          iVar1 = Abc_ZddThresh(p,t1,5);
          iVar1 = Abc_ZddDiff(p,iVar1,b2);
          iVar2 = Abc_MinInt(*(uint *)pAVar3 & 0x7fffffff,*(uint *)pAVar4 & 0x7fffffff);
          iVar1 = Abc_ZddUniqueCreate(p,iVar2,iVar1,b2);
          p_local._4_4_ = Abc_ZddCacheInsert(p,a,b,0xb,iVar1);
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_ZddDotMinProduct6( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A, * B; 
    int r0, r1, b2, t1, t2, r;
    if ( a == 0 ) return 0;
    if ( b == 0 ) return 0;
    if ( a == 1 ) return b;
    if ( b == 1 ) return a;
    if ( a > b )  return Abc_ZddDotMinProduct6( p, b, a );
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_DOT_PROD_6)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    B = Abc_ZddNode( p, b );
    if ( A->Var < B->Var )
        r0 = Abc_ZddDotMinProduct6( p, A->False, b ), 
        r1 = Abc_ZddDotMinProduct6( p, A->True, b );
    else if ( A->Var > B->Var )
        r0 = Abc_ZddDotMinProduct6( p, a, B->False ), 
        r1 = Abc_ZddDotMinProduct6( p, a, B->True ); 
    else
        r0 = Abc_ZddDotMinProduct6( p, A->False, B->False ),
        b2 = Abc_ZddMinUnion( p, B->False, B->True ), 
        t1 = Abc_ZddDotMinProduct6( p, A->True, b2 ), 
        t2 = Abc_ZddDotMinProduct6( p, A->False, B->True ), 
        r1 = Abc_ZddMinUnion( p, t1, t2 );
    r1 = Abc_ZddThresh( p, r1, 5 ),
    r1 = Abc_ZddDiff( p, r1, r0 ); 
    r = Abc_ZddUniqueCreate( p, Abc_MinInt(A->Var, B->Var), r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_DOT_PROD_6, r );
}